

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O1

void __thiscall
duckdb::ArrowArrayStreamWrapper::GetSchema(ArrowArrayStreamWrapper *this,ArrowSchemaWrapper *schema)

{
  int iVar1;
  char *pcVar2;
  InvalidInputException *pIVar3;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (*(this->arrow_array_stream).get_schema)(&this->arrow_array_stream,&schema->arrow_schema);
  if (iVar1 != 0) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"arrow_scan: get_schema failed(): %s","");
    pcVar2 = (*(this->arrow_array_stream).get_last_error)(&this->arrow_array_stream);
    ::std::__cxx11::string::string((string *)&local_48,pcVar2,&local_69);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_68,&local_48);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((schema->arrow_schema).release != (_func_void_ArrowSchema_ptr *)0x0) {
    if (0 < (schema->arrow_schema).n_children) {
      return;
    }
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"arrow_scan: empty schema passed","");
    InvalidInputException::InvalidInputException(pIVar3,(string *)&local_68);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"arrow_scan: released schema passed","");
  InvalidInputException::InvalidInputException(pIVar3,(string *)&local_68);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ArrowArrayStreamWrapper::GetSchema(ArrowSchemaWrapper &schema) {
	D_ASSERT(arrow_array_stream.get_schema);
	// LCOV_EXCL_START
	if (arrow_array_stream.get_schema(&arrow_array_stream, &schema.arrow_schema)) {
		throw InvalidInputException("arrow_scan: get_schema failed(): %s", string(GetError()));
	}
	if (!schema.arrow_schema.release) {
		throw InvalidInputException("arrow_scan: released schema passed");
	}
	if (schema.arrow_schema.n_children < 1) {
		throw InvalidInputException("arrow_scan: empty schema passed");
	}
	// LCOV_EXCL_STOP
}